

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

int read_int32_info(WavpackStream *wps,WavpackMetadata *wpmd)

{
  uchar *puVar1;
  bool bVar2;
  char *byteptr;
  int bytecnt;
  WavpackMetadata *wpmd_local;
  WavpackStream *wps_local;
  uint local_4;
  
  puVar1 = (uchar *)wpmd->data;
  bVar2 = wpmd->byte_length == 4;
  if (bVar2) {
    wps->int32_sent_bits = *puVar1;
    wps->int32_zeros = puVar1[1];
    wps->int32_ones = puVar1[2];
    wps->int32_dups = puVar1[3];
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

int read_int32_info (WavpackStream *wps, WavpackMetadata *wpmd)
{
    int bytecnt = wpmd->byte_length;
    char *byteptr = wpmd->data;

    if (bytecnt != 4)
        return FALSE;

    wps->int32_sent_bits = *byteptr++;
    wps->int32_zeros = *byteptr++;
    wps->int32_ones = *byteptr++;
    wps->int32_dups = *byteptr;
    return TRUE;
}